

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_hello_decode_server_name(ptls_iovec_t *name,uint8_t **src,uint8_t *end)

{
  uint8_t uVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  void *pvVar5;
  ptls_iovec_t pVar6;
  uint8_t *local_70;
  size_t local_68;
  uint8_t *end_2;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t type;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint8_t *end_local;
  uint8_t **src_local;
  ptls_iovec_t *name_local;
  
  _capacity._4_4_ = 0;
  _block_size = 2;
  if ((ulong)((long)end - (long)*src) < 2) {
    _capacity._4_4_ = 0x32;
  }
  else {
    end_1 = (uint8_t *)0x0;
    do {
      pbVar2 = *src;
      *src = pbVar2 + 1;
      end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*pbVar2);
      _block_size = _block_size - 1;
    } while (_block_size != 0);
    if (end + -(long)*src < end_1) {
      _capacity._4_4_ = 0x32;
    }
    else {
      puVar3 = *src + (long)end_1;
      if (*src == puVar3) {
        _capacity._4_4_ = 0x32;
      }
      else {
        do {
          puVar4 = *src;
          *src = puVar4 + 1;
          uVar1 = *puVar4;
          _block_size_1 = 2;
          if ((ulong)((long)puVar3 - (long)*src) < 2) {
            return 0x32;
          }
          end_2 = (uint8_t *)0x0;
          do {
            pbVar2 = *src;
            *src = pbVar2 + 1;
            end_2 = (uint8_t *)((long)end_2 << 8 | (ulong)*pbVar2);
            _block_size_1 = _block_size_1 - 1;
          } while (_block_size_1 != 0);
          if (puVar3 + -(long)*src < end_2) {
            return 0x32;
          }
          puVar4 = *src + (long)end_2;
          if (uVar1 == '\0') {
            pvVar5 = memchr(*src,0,(long)puVar4 - (long)*src);
            if (pvVar5 != (void *)0x0) {
              return 0x2f;
            }
            pVar6 = ptls_iovec_init(*src,(long)puVar4 - (long)*src);
            local_70 = pVar6.base;
            name->base = local_70;
            local_68 = pVar6.len;
            name->len = local_68;
          }
          *src = puVar4;
          if (*src != puVar4) {
            return 0x32;
          }
        } while (*src != puVar3);
        if (*src != puVar3) {
          _capacity._4_4_ = 0x32;
        }
      }
    }
  }
  return _capacity._4_4_;
}

Assistant:

static int client_hello_decode_server_name(ptls_iovec_t *name, const uint8_t **src, const uint8_t *const end)
{
    int ret = 0;

    ptls_decode_open_block(*src, end, 2, {
        if (*src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        do {
            uint8_t type = *(*src)++;
            ptls_decode_open_block(*src, end, 2, {
                switch (type) {
                case PTLS_SERVER_NAME_TYPE_HOSTNAME:
                    if (memchr(*src, '\0', end - *src) != 0) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    *name = ptls_iovec_init(*src, end - *src);
                    break;
                default:
                    break;
                }
                *src = end;
            });
        } while (*src != end);
    });

Exit:
    return ret;
}